

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structurally_valid.cc
# Opt level: O0

char * google::protobuf::internal::UTF8CoerceToStructurallyValid
                 (StringPiece *src_str,char *idst,char replace_char)

{
  int iVar1;
  stringpiece_ssize_type sVar2;
  char *pcVar3;
  char *pcVar4;
  StringPiece *str;
  char in_DL;
  char *in_RSI;
  StringPiece *in_RDI;
  StringPiece str2;
  char *dst;
  char *srclimit;
  char *src;
  int n;
  int len;
  char *isrc;
  StringPiece SStackY_58;
  StringPiece *in_stack_ffffffffffffffb8;
  char *local_38;
  char *local_8;
  
  local_8 = StringPiece::data(in_RDI);
  sVar2 = StringPiece::length(in_RDI);
  iVar1 = UTF8SpnStructurallyValid(in_stack_ffffffffffffffb8);
  if (iVar1 != (int)sVar2) {
    pcVar3 = local_8 + (int)sVar2;
    pcVar4 = in_RSI;
    memmove(in_RSI,local_8,(long)iVar1);
    pcVar4 = pcVar4 + iVar1;
    for (local_38 = local_8 + iVar1; local_8 = in_RSI, local_38 < pcVar3;
        local_38 = local_38 + iVar1) {
      *pcVar4 = in_DL;
      local_38 = local_38 + 1;
      str = (StringPiece *)(pcVar4 + 1);
      StringPiece::StringPiece(&SStackY_58,local_38,(long)pcVar3 - (long)local_38);
      iVar1 = UTF8SpnStructurallyValid(str);
      memmove(str,local_38,(long)iVar1);
      pcVar4 = (char *)((long)&str->ptr_ + (long)iVar1);
    }
  }
  return local_8;
}

Assistant:

char* UTF8CoerceToStructurallyValid(const StringPiece& src_str,
                                    char* idst,
                                    const char replace_char) {
  const char* isrc = src_str.data();
  const int len = src_str.length();
  int n = UTF8SpnStructurallyValid(src_str);
  if (n == len) {               // Normal case -- all is cool, return
    return const_cast<char*>(isrc);
  } else {                      // Unusual case -- copy w/o bad bytes
    const char* src = isrc;
    const char* srclimit = isrc + len;
    char* dst = idst;
    memmove(dst, src, n);       // Copy initial good chunk
    src += n;
    dst += n;
    while (src < srclimit) {    // src points to bogus byte or is off the end
      dst[0] = replace_char;                    // replace one bad byte
      src++;
      dst++;
      StringPiece str2(src, srclimit - src);
      n = UTF8SpnStructurallyValid(str2);       // scan the remainder
      memmove(dst, src, n);                     // copy next good chunk
      src += n;
      dst += n;
    }
  }
  return idst;
}